

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

TypePointer * __thiscall TypeFactory::getTypePointer(TypeFactory *this,int4 s,Datatype *pt,uint4 ws)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypePointer *pTVar2;
  TypePointer tmp;
  Datatype local_60;
  Datatype *local_20;
  uint4 local_18;
  
  for (; pt->metatype == TYPE_ARRAY; pt = (Datatype *)pt[1]._vptr_Datatype) {
  }
  paVar1 = &local_60.name.field_2;
  local_60.name._M_string_length = 0;
  local_60.name.field_2._M_local_buf[0] = '\0';
  local_60.id = 0;
  local_60._vptr_Datatype = (_func_int **)&PTR_restoreXml_003c3060;
  local_60._48_8_ = CONCAT44(pt->flags,2) & 0x1ffffffff;
  local_60.size = s;
  local_60.name._M_dataplus._M_p = (pointer)paVar1;
  local_20 = pt;
  local_18 = ws;
  pTVar2 = (TypePointer *)findAdd(this,&local_60);
  local_60._vptr_Datatype = (_func_int **)&PTR_restoreXml_003c2eb8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.name._M_dataplus._M_p);
  }
  return pTVar2;
}

Assistant:

TypePointer *TypeFactory::getTypePointer(int4 s,Datatype *pt,uint4 ws)

{				// Create pointer to type -pt-
  if (pt->getMetatype() == TYPE_ARRAY) {
    // Do no allow pointers to array
    do {
      pt = ((TypeArray *)pt)->getBase();
    } while(pt->getMetatype() == TYPE_ARRAY);
  }
  TypePointer tmp(s,pt,ws);
  return (TypePointer *) findAdd(tmp);
}